

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

void __thiscall BronKerbosch::printSet(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  size_type pos;
  ostream *poVar1;
  
  for (pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(set);
      pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(set,pos)
      ) {
    poVar1 = std::operator<<(os," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void BronKerbosch::printSet(std::ostream& os, alignment_set_t set) {
    for (auto j = set.find_first(); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << " " << j;
    }
    os << endl;
}